

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O2

double __thiscall Colony::get_rand(Colony *this)

{
  result_type_conflict1 rVar1;
  uint uVar2;
  random_device rand_dev;
  mt19937 generator;
  uniform_real_distribution<double> local_2728;
  random_device local_2718;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1390;
  
  std::random_device::random_device(&local_2718);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_1390,(ulong)uVar2);
  local_2728._M_param._M_a._0_4_ = 0;
  local_2728._M_param._M_a._4_4_ = 0;
  local_2728._M_param._M_b._0_4_ = 0;
  local_2728._M_param._M_b._4_4_ = 0x3ff00000;
  rVar1 = std::uniform_real_distribution<double>::operator()(&local_2728,&local_1390);
  std::random_device::~random_device(&local_2718);
  return rVar1;
}

Assistant:

double Colony::get_rand() const
{
    std::random_device rand_dev;
    std::mt19937 generator(rand_dev());
    std::uniform_real_distribution<double> distr(0, 1);
    return distr(generator);
}